

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O0

void __thiscall HandleManager::sessionClosed(HandleManager *this,CK_SESSION_HANDLE hSession)

{
  bool bVar1;
  iterator slotID_00;
  pointer ppVar2;
  iterator __position;
  CK_SESSION_HANDLE in_RSI;
  long in_RDI;
  bool bVar3;
  Handle *h;
  CK_ULONG openSessionCount;
  iterator it;
  MutexLocker lock;
  CK_SLOT_ID slotID;
  Mutex *in_stack_ffffffffffffff38;
  iterator in_stack_ffffffffffffff40;
  iterator in_stack_ffffffffffffff48;
  _Self local_78;
  _Base_ptr local_70;
  long local_68;
  _Base_ptr local_60;
  _Base_ptr local_58;
  undefined4 in_stack_ffffffffffffffb4;
  HandleManager *in_stack_ffffffffffffffc0;
  _Self local_30 [3];
  CK_SLOT_ID local_18;
  CK_SESSION_HANDLE local_10;
  
  local_10 = in_RSI;
  MutexLocker::MutexLocker
            ((MutexLocker *)in_stack_ffffffffffffff40._M_node,in_stack_ffffffffffffff38);
  local_30[0]._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_Handle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Handle>_>_>
       ::find((map<unsigned_long,_Handle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Handle>_>_>
               *)in_stack_ffffffffffffff38,(key_type *)0x1ccbdb);
  slotID_00 = std::
              map<unsigned_long,_Handle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Handle>_>_>
              ::end((map<unsigned_long,_Handle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Handle>_>_>
                     *)in_stack_ffffffffffffff38);
  bVar1 = std::operator==(local_30,(_Self *)&stack0xffffffffffffffb8);
  bVar3 = true;
  if (!bVar1) {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Handle>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_unsigned_long,_Handle>_> *)0x1ccc34);
    bVar3 = (ppVar2->second).kind != 1;
  }
  if (!bVar3) {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Handle>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_unsigned_long,_Handle>_> *)0x1ccc91);
    local_18 = (ppVar2->second).slotID;
    local_58 = local_30[0]._M_node;
    local_60 = (_Base_ptr)
               std::
               map<unsigned_long,Handle,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,Handle>>>
               ::erase_abi_cxx11_(in_stack_ffffffffffffff40._M_node,in_stack_ffffffffffffff48);
    local_68 = 0;
    local_70 = (_Base_ptr)
               std::
               map<unsigned_long,_Handle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Handle>_>_>
               ::begin((map<unsigned_long,_Handle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Handle>_>_>
                        *)in_stack_ffffffffffffff38);
    local_30[0]._M_node = local_70;
    while( true ) {
      local_78._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_Handle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Handle>_>_>
           ::end((map<unsigned_long,_Handle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Handle>_>_>
                  *)in_stack_ffffffffffffff38);
      bVar3 = std::operator!=(local_30,&local_78);
      if (!bVar3) break;
      ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Handle>_>::operator->
                         ((_Rb_tree_iterator<std::pair<const_unsigned_long,_Handle>_> *)0x1ccd32);
      if (((ppVar2->second).kind == 1) && (local_18 == (ppVar2->second).slotID)) {
        local_68 = local_68 + 1;
LAB_001cce0b:
        std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Handle>_>::operator++
                  ((_Rb_tree_iterator<std::pair<const_unsigned_long,_Handle>_> *)
                   in_stack_ffffffffffffff40._M_node);
      }
      else {
        if (((ppVar2->second).kind != 2) || (local_10 != (ppVar2->second).hSession))
        goto LAB_001cce0b;
        __position._M_node = (_Base_ptr)(in_RDI + 0x40);
        std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Handle>_>::operator->
                  ((_Rb_tree_iterator<std::pair<const_unsigned_long,_Handle>_> *)0x1ccdb1);
        std::
        map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
        ::erase((map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                 *)in_stack_ffffffffffffff40._M_node,&in_stack_ffffffffffffff38->_vptr_Mutex);
        in_stack_ffffffffffffff38 = (Mutex *)(in_RDI + 0x10);
        std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Handle>_>::operator++
                  ((_Rb_tree_iterator<std::pair<const_unsigned_long,_Handle>_> *)__position._M_node,
                   (int)((ulong)in_stack_ffffffffffffff40._M_node >> 0x20));
        in_stack_ffffffffffffff40 =
             std::
             map<unsigned_long,Handle,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,Handle>>>
             ::erase_abi_cxx11_(in_stack_ffffffffffffff40._M_node,__position);
      }
    }
    if (local_68 == 0) {
      allSessionsClosed(in_stack_ffffffffffffffc0,(CK_SLOT_ID)slotID_00._M_node,
                        SUB41((uint)in_stack_ffffffffffffffb4 >> 0x18,0));
    }
  }
  MutexLocker::~MutexLocker((MutexLocker *)in_stack_ffffffffffffff40._M_node);
  return;
}

Assistant:

void HandleManager::sessionClosed(const CK_SESSION_HANDLE hSession)
{
	CK_SLOT_ID slotID;
	MutexLocker lock(handlesMutex);

	std::map< CK_ULONG, Handle>::iterator it = handles.find(hSession);
	if (it == handles.end() || CKH_SESSION != it->second.kind)
		return; // Unable to find the specified session.

	slotID = it->second.slotID;

	// session closed, so we can erase information about it.
	handles.erase(it);

	// Erase all session object handles associated with the given session handle.
	CK_ULONG openSessionCount = 0;
	for (it = handles.begin(); it != handles.end(); ) {
		Handle &h = it->second;
		if (CKH_SESSION == h.kind && slotID == h.slotID) {
			++openSessionCount; // another session is open for this slotID.
		} else {
			if (CKH_OBJECT == h.kind && hSession == h.hSession) {
				// A session object is present for the given session, so erase it.
				objects.erase(it->second.object);
				// Iterator post-incrementing (it++) will return a copy of the original it (which points to handle to be deleted).
				handles.erase(it++);
				continue;
			}
		}
		++it;
	}

	 // We are done when there are still sessions open.
	if (openSessionCount)
		return;

	// No more sessions open for this token, so remove all object handles that are still valid for the given slotID.
	allSessionsClosed(slotID, true);
}